

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O3

char * flatbuffers::GenerateTextImpl
                 (Parser *parser,Table *table,StructDef *struct_def,string *_text)

{
  char *pcVar1;
  JsonPrinter printer;
  JsonPrinter local_28;
  
  local_28.opts = &parser->opts;
  local_28.text = _text;
  std::__cxx11::string::reserve((ulong)_text);
  pcVar1 = JsonPrinter::GenStruct(&local_28,struct_def,table,0);
  if ((pcVar1 == (char *)0x0) && (-1 < (local_28.opts)->indent_step)) {
    std::__cxx11::string::push_back((char)local_28.text);
  }
  return pcVar1;
}

Assistant:

static const char *GenerateTextImpl(const Parser &parser, const Table *table,
                                    const StructDef &struct_def,
                                    std::string *_text) {
  JsonPrinter printer(parser, *_text);
  auto err = printer.GenStruct(struct_def, table, 0);
  if (err) return err;
  printer.AddNewLine();
  return nullptr;
}